

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O1

void __thiscall TRM::Model::Model(Model *this,char *filename)

{
  pointer *ppvVar1;
  pointer *ppvVar2;
  long lVar3;
  iterator iVar4;
  iterator __position;
  char cVar5;
  int i;
  int iVar6;
  istream *piVar7;
  long *plVar8;
  ostream *poVar9;
  anon_union_4_3_4e90da17_for_vec<3,_int,_(glm::qualifier)0>_3 *paVar10;
  int i_1;
  char trash;
  vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
  f;
  string line;
  Vec3i tmp;
  ifstream in;
  istringstream iss;
  undefined1 auStack_458 [15];
  char local_449;
  TGAImage *local_448;
  Model *local_440;
  vec<2,_float,_(glm::qualifier)0> local_438;
  iterator iStack_430;
  vec<3,_int,_(glm::qualifier)0> *local_428 [3];
  char *local_410;
  undefined8 local_408;
  char local_400;
  undefined7 uStack_3ff;
  undefined8 local_3ec;
  anon_union_4_3_4e90da17_for_vec<3,_int,_(glm::qualifier)0>_3 local_3e4;
  vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
  *local_3e0;
  vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
  *local_3d8;
  vector<std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>,_std::allocator<std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>_>_>
  *local_3d0;
  TGAImage *local_3c8;
  TGAImage *local_3c0;
  long local_3b8 [4];
  byte abStack_398 [488];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  local_3d0 = &this->faces_;
  local_3d8 = (vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
               *)&this->norms_;
  local_3e0 = (vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
               *)&this->uv_;
  local_448 = &this->diffusemap_;
  (this->uv_).
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->uv_).
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->norms_).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->uv_).
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->norms_).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->norms_).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->faces_).
  super__Vector_base<std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>,_std::allocator<std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->faces_).
  super__Vector_base<std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>,_std::allocator<std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->verts_).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->faces_).
  super__Vector_base<std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>,_std::allocator<std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->verts_).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->verts_).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_440 = this;
  TGAImage::TGAImage(local_448);
  local_3c0 = &this->normalmap_;
  TGAImage::TGAImage(local_3c0);
  local_3c8 = &this->specularmap_;
  TGAImage::TGAImage(local_3c8);
  std::ifstream::ifstream(local_3b8);
  std::ifstream::open((char *)local_3b8,(_Ios_Openmode)filename);
  if ((abStack_398[*(long *)(local_3b8[0] + -0x18)] & 5) == 0) {
    local_410 = &local_400;
    local_408 = 0;
    local_400 = '\0';
    lVar3 = *(long *)(local_3b8[0] + -0x18);
    if ((abStack_398[lVar3] & 2) == 0) {
      do {
        cVar5 = std::ios::widen((char)auStack_458 + (char)lVar3 + -0x60);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_3b8,(string *)&local_410,cVar5);
        std::__cxx11::string::string((string *)&local_438,local_410,(allocator *)&local_3ec);
        std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_438,_S_in);
        if (local_438 != (vec<2,_float,_(glm::qualifier)0>)local_428) {
          operator_delete((void *)local_438,(ulong)((long)&local_428[0]->field_0 + 1));
        }
        iVar6 = std::__cxx11::string::compare((ulong)&local_410,0,(char *)0x2);
        if (iVar6 == 0) {
          std::operator>>((istream *)local_1b0,&local_449);
          iVar6 = 0;
          do {
            std::istream::_M_extract<float>((float *)local_1b0);
            iVar6 = iVar6 + 1;
          } while (iVar6 != 3);
          iVar4._M_current =
               (local_440->verts_).
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (local_440->verts_).
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
            ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>const&>
                      ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                        *)local_440,iVar4,(vec<3,_float,_(glm::qualifier)0> *)&local_438);
          }
          else {
            (iVar4._M_current)->field_2 = iStack_430._M_current._0_4_;
            (iVar4._M_current)->field_0 =
                 (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_438.field_0;
            (iVar4._M_current)->field_1 =
                 (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_438.field_1;
            ppvVar1 = &(local_440->verts_).
                       super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppvVar1 = *ppvVar1 + 1;
          }
        }
        else {
          iVar6 = std::__cxx11::string::compare((ulong)&local_410,0,(char *)0x3);
          if (iVar6 == 0) {
            piVar7 = std::operator>>((istream *)local_1b0,&local_449);
            std::operator>>(piVar7,&local_449);
            iVar6 = 0;
            do {
              std::istream::_M_extract<float>((float *)local_1b0);
              iVar6 = iVar6 + 1;
            } while (iVar6 != 3);
            iVar4._M_current =
                 (local_440->norms_).
                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (local_440->norms_).
                super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
              ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>const&>
                        (local_3d8,iVar4,(vec<3,_float,_(glm::qualifier)0> *)&local_438);
            }
            else {
              (iVar4._M_current)->field_2 = iStack_430._M_current._0_4_;
              (iVar4._M_current)->field_0 =
                   (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_438.field_0
              ;
              (iVar4._M_current)->field_1 =
                   (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_438.field_1
              ;
              ppvVar1 = &(local_440->norms_).
                         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppvVar1 = *ppvVar1 + 1;
            }
          }
          else {
            iVar6 = std::__cxx11::string::compare((ulong)&local_410,0,(char *)0x3);
            if (iVar6 == 0) {
              piVar7 = std::operator>>((istream *)local_1b0,&local_449);
              std::operator>>(piVar7,&local_449);
              iVar6 = 1;
              do {
                iVar6 = iVar6 + -1;
                std::istream::_M_extract<float>((float *)local_1b0);
              } while (iVar6 == 0);
              __position._M_current =
                   (local_440->uv_).
                   super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (local_440->uv_).
                  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                ::_M_realloc_insert<glm::vec<2,float,(glm::qualifier)0>const&>
                          (local_3e0,__position,&local_438);
              }
              else {
                *__position._M_current = local_438;
                ppvVar2 = &(local_440->uv_).
                           super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppvVar2 = *ppvVar2 + 1;
              }
            }
            else {
              iVar6 = std::__cxx11::string::compare((ulong)&local_410,0,(char *)0x2);
              if (iVar6 == 0) {
                local_438.field_0 =
                     (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
                local_438.field_1 =
                     (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
                iStack_430._M_current = (vec<3,_int,_(glm::qualifier)0> *)0x0;
                local_428[0] = (vec<3,_int,_(glm::qualifier)0> *)0x0;
                std::operator>>((istream *)local_1b0,&local_449);
                while( true ) {
                  piVar7 = (istream *)
                           std::istream::operator>>
                                     ((istream *)local_1b0,
                                      &((anon_union_4_3_4e90da17_for_vec<3,_int,_(glm::qualifier)0>_3
                                         *)&local_3ec)->x);
                  piVar7 = std::operator>>(piVar7,&local_449);
                  piVar7 = (istream *)
                           std::istream::operator>>
                                     (piVar7,&((anon_union_4_3_4e90da17_for_vec<3,_int,_(glm::qualifier)0>_3
                                                *)((long)&local_3ec + 4))->x);
                  piVar7 = std::operator>>(piVar7,&local_449);
                  plVar8 = (long *)std::istream::operator>>(piVar7,&local_3e4.x);
                  if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0) break;
                  iVar6 = 0;
                  do {
                    paVar10 = &local_3e4;
                    if ((iVar6 != 2) &&
                       (paVar10 = (anon_union_4_3_4e90da17_for_vec<3,_int,_(glm::qualifier)0>_3 *)
                                  &local_3ec, iVar6 == 1)) {
                      paVar10 = (anon_union_4_3_4e90da17_for_vec<3,_int,_(glm::qualifier)0>_3 *)
                                ((long)&local_3ec + 4);
                    }
                    paVar10->x = paVar10->x + -1;
                    iVar6 = iVar6 + 1;
                  } while (iVar6 != 3);
                  if (iStack_430._M_current == local_428[0]) {
                    std::
                    vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
                    ::_M_realloc_insert<glm::vec<3,int,(glm::qualifier)0>const&>
                              ((vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
                                *)&local_438,iStack_430,(vec<3,_int,_(glm::qualifier)0> *)&local_3ec
                              );
                  }
                  else {
                    (iStack_430._M_current)->field_2 =
                         (anon_union_4_3_4e909dac_for_vec<3,_int,_(glm::qualifier)0>_7)local_3e4;
                    (iStack_430._M_current)->field_0 =
                         (anon_union_4_3_4e90da17_for_vec<3,_int,_(glm::qualifier)0>_3)
                         (undefined4)local_3ec;
                    (iStack_430._M_current)->field_1 =
                         (anon_union_4_3_4e90b0ec_for_vec<3,_int,_(glm::qualifier)0>_5)
                         local_3ec._4_4_;
                    iStack_430._M_current = iStack_430._M_current + 1;
                  }
                }
                std::
                vector<std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>,_std::allocator<std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>_>_>
                ::push_back(local_3d0,(value_type *)&local_438);
                if (local_438 != (vec<2,_float,_(glm::qualifier)0>)0x0) {
                  operator_delete((void *)local_438,(long)local_428[0] - (long)local_438);
                }
              }
            }
          }
        }
        std::__cxx11::istringstream::~istringstream(local_1b0);
        std::ios_base::~ios_base(local_138);
        lVar3 = *(long *)(local_3b8[0] + -0x18);
      } while ((abStack_398[lVar3] & 2) == 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"# v# ",5);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," f# ",4);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," vt# ",5);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," vn# ",5);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if (local_410 != &local_400) {
      operator_delete(local_410,CONCAT71(uStack_3ff,local_400) + 1);
    }
  }
  std::ifstream::~ifstream(local_3b8);
  return;
}

Assistant:

Model::Model(const char *filename)
    : verts_(),
      faces_(),
      norms_(),
      uv_(),
      diffusemap_(),
      normalmap_(),
      specularmap_() {
  std::ifstream in;
  in.open(filename, std::ifstream::in);
  if (in.fail()) return;
  std::string line;
  while (!in.eof()) {
    std::getline(in, line);
    std::istringstream iss(line.c_str());
    char trash;
    if (!line.compare(0, 2, "v ")) {
      iss >> trash;
      Vec3f v;
      for (int i = 0; i < 3; i++) iss >> v[i];
      verts_.push_back(v);
    } else if (!line.compare(0, 3, "vn ")) {
      iss >> trash >> trash;
      Vec3f n;
      for (int i = 0; i < 3; i++) iss >> n[i];
      norms_.push_back(n);
    } else if (!line.compare(0, 3, "vt ")) {
      iss >> trash >> trash;
      Vec2f uv;
      for (int i = 0; i < 2; i++) iss >> uv[i];
      uv_.push_back(uv);
    } else if (!line.compare(0, 2, "f ")) {
      std::vector<Vec3i> f;
      Vec3i tmp;
      iss >> trash;
      while (iss >> tmp[0] >> trash >> tmp[1] >> trash >> tmp[2]) {
        for (int i = 0; i < 3; i++)
          tmp[i]--;  // in wavefront obj all indices start at 1, not zero
        f.push_back(tmp);
      }
      faces_.push_back(f);
    }
  }
  std::cerr << "# v# " << verts_.size() << " f# " << faces_.size() << " vt# "
            << uv_.size() << " vn# " << norms_.size() << std::endl;
  //    load_texture(filename, "_diffuse.tga", diffusemap_);
  //    load_texture(filename, "_nm_tangent.tga",      normalmap_);
  //    load_texture(filename, "_spec.tga",    specularmap_);
}